

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# permutation.cpp
# Opt level: O0

bool __thiscall Permutation::IsIdentity(Permutation *this)

{
  size_type sVar1;
  const_reference pvVar2;
  int local_1c;
  int i;
  Permutation *this_local;
  
  local_1c = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(&this->permutation_);
    if ((int)sVar1 <= local_1c) {
      return true;
    }
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&this->permutation_,(long)local_1c);
    if (*pvVar2 != local_1c) break;
    local_1c = local_1c + 1;
  }
  return false;
}

Assistant:

bool Permutation::IsIdentity() const {
    for (int i = 0; i < static_cast<int>(permutation_.size()); ++i) {
        if (permutation_[i] != i) {
            return false;
        }
    }

    return true;
}